

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O0

void __thiscall cmCTestUploadCommand::CheckArguments(cmCTestUploadCommand *this)

{
  cmCTestUploadCommand *this_local;
  
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmCTestUploadCommand::CheckArguments()::__0>
            (&(this->Files).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,(anon_class_8_1_8991fb9c_for__M_pred)this);
  return;
}

Assistant:

void cmCTestUploadCommand::CheckArguments()
{
  cm::erase_if(this->Files, [this](std::string const& arg) -> bool {
    if (!cmSystemTools::FileExists(arg)) {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return true;
    }
    return false;
  });
}